

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadGridMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this_00;
  string *psVar1;
  GridMeshNode *pGVar2;
  ulong siglen;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *sig;
  uchar *extraout_RDX_00;
  long lVar3;
  ulong uVar4;
  uchar *in_R8;
  size_t in_R9;
  size_t i;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *this_01;
  undefined1 auVar5 [16];
  Ref<embree::XML> animation;
  allocator local_a1;
  GridMeshNode *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_90 [16];
  _Alloc_hider local_80;
  undefined1 local_78 [8];
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> grids;
  _Alloc_hider local_48;
  Ref<embree::SceneGraph::MaterialNode> material;
  
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_98,"material",(allocator *)&animation);
  XML::child((XML *)&grids,psVar1);
  loadMaterial((XMLLoader *)&material,xml);
  if (grids.super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)&(grids.
                            super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_98);
  local_a0 = (GridMeshNode *)::operator_new(0xa8);
  local_48._M_p = (pointer)material.ptr;
  if (material.ptr != (MaterialNode *)0x0) {
    (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  pGVar2 = local_a0;
  SceneGraph::GridMeshNode::GridMeshNode
            (local_a0,(Ref<embree::SceneGraph::MaterialNode> *)&local_48,(BBox1f)0x3f80000000000000,
             0);
  (*(pGVar2->super_Node).super_RefCount._vptr_RefCount[2])(pGVar2);
  if ((MaterialNode *)local_48._M_p != (MaterialNode *)0x0) {
    (**(code **)(*(long *)local_48._M_p + 0x18))();
  }
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_98,"animated_positions",(allocator *)&grids);
  XML::childOpt((XML *)&animation,psVar1);
  std::__cxx11::string::~string((string *)&local_98);
  this_00 = &local_a0->positions;
  if (animation.ptr == (XML *)0x0) {
    psVar1 = (string *)*in_RDX;
    std::__cxx11::string::string((string *)&grids,"positions",&local_a1);
    XML::childOpt((XML *)local_78,psVar1);
    loadVec3faArray((avector<Vec3fa> *)&local_98,(XMLLoader *)xml,(Ref<embree::XML> *)local_78);
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)this_00,
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               &local_98);
    alignedFree(local_80._M_p);
    local_80._M_p = (pointer)0x0;
    local_90 = (undefined1  [16])0x0;
    if (local_78 != (undefined1  [8])0x0) {
      (*((RefCount *)local_78)->_vptr_RefCount[3])();
    }
    std::__cxx11::string::~string((string *)&grids);
    if (animation.ptr == (XML *)0x0) goto LAB_00173342;
  }
  else {
    for (uVar4 = 0;
        uVar4 < (ulong)((long)((animation.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)((animation.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      XML::child((XML *)&grids,(size_t)animation.ptr);
      loadVec3faArray((avector<Vec3fa> *)&local_98,(XMLLoader *)xml,(Ref<embree::XML> *)&grids);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)this_00,(avector<Vec3fa> *)&local_98);
      alignedFree(local_80._M_p);
      local_80._M_p = (pointer)0x0;
      local_90 = (undefined1  [16])0x0;
      if (grids.super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(grids.
                                super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0 + 0x18))();
      }
    }
  }
  (*((animation.ptr)->super_RefCount)._vptr_RefCount[3])(animation.ptr);
LAB_00173342:
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_98,"grids",(allocator *)local_78);
  XML::childOpt((XML *)&animation,psVar1);
  loadVec4iArray(&grids,(XMLLoader *)xml,&animation);
  if (animation.ptr != (XML *)0x0) {
    (*((animation.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_98);
  this_01 = &local_a0->grids;
  lVar3 = 8;
  uVar4 = 0;
  sig = extraout_RDX;
  while( true ) {
    pGVar2 = local_a0;
    siglen = (long)grids.super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)grids.super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    if (siglen <= uVar4) break;
    local_98._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          ((long)grids.super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar3 + -8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)((long)&(grids.
                                      super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar3);
    auVar5 = pshuflw(auVar5,auVar5,0xe8);
    local_90._0_4_ = auVar5._0_4_;
    xml = (Ref<embree::XML> *)&local_98;
    std::
    vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
    ::emplace_back<embree::SceneGraph::GridMeshNode::Grid>(this_01,(Grid *)&local_98);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x10;
    sig = extraout_RDX_00;
  }
  SceneGraph::GridMeshNode::verify(local_a0,(EVP_PKEY_CTX *)xml,sig,siglen,in_R8,in_R9);
  (this->path).filename._M_dataplus._M_p = (pointer)pGVar2;
  (**(code **)((long)(pGVar2->super_Node).super_RefCount._vptr_RefCount + 0x10))(pGVar2);
  std::_Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::~_Vector_base
            (&grids.super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>);
  (**(code **)((long)(pGVar2->super_Node).super_RefCount._vptr_RefCount + 0x18))(pGVar2);
  if (material.ptr != (MaterialNode *)0x0) {
    (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadGridMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
    }

    std::vector<Vec4i> grids = loadVec4iArray(xml->childOpt("grids"));
    for (size_t i=0; i<grids.size(); i++) 
      mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(grids[i].x,grids[i].y,grids[i].z,grids[i].w));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }